

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.cpp
# Opt level: O1

void __thiscall embree::LineSegments::LineSegments(LineSegments *this,Device *device,GType gtype)

{
  size_t *psVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  Device *pDVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  undefined4 extraout_var;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  
  Geometry::Geometry(&this->super_Geometry,device,gtype,0,1);
  (this->super_Geometry).super_RefCount._vptr_RefCount = (_func_int **)&PTR__LineSegments_02205f30;
  *(undefined8 *)&(this->super_Geometry).field_0x58 = 0;
  *(undefined8 *)&this->field_0x60 = 0;
  *(undefined8 *)&this->field_0x68 = 0;
  *(undefined8 *)&this->field_0x70 = 0;
  *(undefined8 *)&this->field_0x78 = 0x100000000;
  this->field_0x80 = 1;
  *(undefined8 *)&this->field_0x84 = 0;
  *(undefined8 *)&this->field_0x8c = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.num + 4) = 0;
  (this->vertices0).super_RawBufferView.modCounter = 1;
  (this->vertices0).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->vertices0).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->vertices0).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.num + 4) = 0;
  (this->normals0).super_RawBufferView.modCounter = 1;
  (this->normals0).super_RawBufferView.modified = true;
  *(undefined8 *)&(this->normals0).super_RawBufferView.userData = 0;
  *(undefined8 *)((long)&(this->normals0).super_RawBufferView.buffer.ptr + 4) = 0;
  *(undefined8 *)((long)&(this->flags).super_RawBufferView.ptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->flags).super_RawBufferView.dptr_ofs + 4) = 0;
  *(undefined8 *)((long)&(this->flags).super_RawBufferView.stride + 4) = 0;
  *(undefined8 *)((long)&(this->flags).super_RawBufferView.num + 4) = 0;
  (this->flags).super_RawBufferView.modCounter = 1;
  (this->flags).super_RawBufferView.modified = true;
  (this->flags).super_RawBufferView.userData = 0;
  (this->flags).super_RawBufferView.buffer.ptr = (Buffer *)0x0;
  pDVar4 = (this->super_Geometry).device;
  (this->vertices).alloc.device = pDVar4;
  psVar1 = &(this->vertices).size_active;
  (this->vertices).size_active = 0;
  (this->vertices).size_alloced = 0;
  (this->vertices).items = (BufferView<embree::Vec3fx> *)0x0;
  (this->normals).alloc.device = pDVar4;
  (this->normals).size_active = 0;
  (this->normals).size_alloced = 0;
  (this->normals).items = (BufferView<embree::Vec3fa> *)0x0;
  (this->vertexAttribs).alloc.device = pDVar4;
  (this->vertexAttribs).size_active = 0;
  (this->vertexAttribs).size_alloced = 0;
  (this->vertexAttribs).items = (BufferView<char> *)0x0;
  this->tessellationRate = 4;
  this->maxRadiusScale = 1.0;
  uVar17 = (ulong)(this->super_Geometry).numTimeSteps;
  if ((this->vertices).size_alloced == uVar17) {
    uVar16 = *psVar1;
    lVar13 = uVar17 - uVar16;
    if (uVar16 <= uVar17 && lVar13 != 0) {
      lVar14 = uVar16 * 0x38 + 0x30;
      do {
        pBVar5 = (this->vertices).items;
        puVar2 = (undefined8 *)((long)pBVar5 + lVar14 + -0x20);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pBVar5 + lVar14 + -0x30);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)((long)pBVar5 + lVar14 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar5 + lVar14 + -8) = 1;
        *(undefined4 *)((long)pBVar5 + lVar14 + -4) = 0;
        *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar14) = 0;
        lVar14 = lVar14 + 0x38;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    *psVar1 = uVar17;
  }
  else {
    pDVar4 = (this->vertices).alloc.device;
    pBVar5 = (this->vertices).items;
    iVar12 = (*(pDVar4->super_State).super_RefCount._vptr_RefCount[8])(pDVar4,uVar17 * 0x38,8);
    (this->vertices).items = (BufferView<embree::Vec3fx> *)CONCAT44(extraout_var,iVar12);
    uVar16 = (this->vertices).size_active;
    if (uVar16 != 0) {
      lVar13 = 0x30;
      uVar15 = 0;
      do {
        pBVar6 = (this->vertices).items;
        puVar2 = (undefined8 *)((long)pBVar5 + lVar13 + -0x30);
        uVar7 = *puVar2;
        uVar8 = puVar2[1];
        puVar2 = (undefined8 *)((long)pBVar5 + lVar13 + -0x20);
        uVar9 = *puVar2;
        uVar10 = puVar2[1];
        puVar2 = (undefined8 *)((long)pBVar5 + lVar13 + -0x10);
        uVar11 = puVar2[1];
        puVar3 = (undefined8 *)((long)pBVar6 + lVar13 + -0x10);
        *puVar3 = *puVar2;
        puVar3[1] = uVar11;
        puVar2 = (undefined8 *)((long)pBVar6 + lVar13 + -0x20);
        *puVar2 = uVar9;
        puVar2[1] = uVar10;
        puVar2 = (undefined8 *)((long)pBVar6 + lVar13 + -0x30);
        *puVar2 = uVar7;
        puVar2[1] = uVar8;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar13) =
             *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar13);
        *(undefined8 *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar13) = 0;
        uVar15 = uVar15 + 1;
        uVar16 = (this->vertices).size_active;
        lVar13 = lVar13 + 0x38;
      } while (uVar15 < uVar16);
    }
    lVar13 = uVar17 - uVar16;
    if (uVar16 <= uVar17 && lVar13 != 0) {
      lVar14 = uVar16 * 0x38 + 0x30;
      do {
        pBVar6 = (this->vertices).items;
        puVar2 = (undefined8 *)((long)pBVar6 + lVar14 + -0x20);
        *puVar2 = 0;
        puVar2[1] = 0;
        puVar2 = (undefined8 *)((long)pBVar6 + lVar14 + -0x30);
        *puVar2 = 0;
        puVar2[1] = 0;
        *(undefined8 *)((long)pBVar6 + lVar14 + -0x10) = 0x100000000;
        *(undefined1 *)((long)pBVar6 + lVar14 + -8) = 1;
        *(undefined4 *)((long)pBVar6 + lVar14 + -4) = 0;
        *(undefined8 *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar14) = 0;
        lVar14 = lVar14 + 0x38;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    pDVar4 = (this->vertices).alloc.device;
    if (pDVar4 != (Device *)0x0) {
      (*(pDVar4->super_State).super_RefCount._vptr_RefCount[9])(pDVar4,pBVar5);
    }
    (this->vertices).size_active = uVar17;
    (this->vertices).size_alloced = uVar17;
  }
  return;
}

Assistant:

LineSegments::LineSegments (Device* device, Geometry::GType gtype)
    : Geometry(device,gtype,0,1), tessellationRate(4)
  {
    vertices.resize(numTimeSteps);
  }